

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O1

float query_decision(active_cover *a,single_learner *l,example *ec,float prediction,float pmin,
                    bool in_dis)

{
  ulong uVar1;
  uint64_t *puVar2;
  bool bVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  bVar3 = 3.0 < (double)ec->weight + a->all->sd->t;
  if (in_dis && bVar3) {
    if (a->oracular == false) {
      fVar6 = pmin * 4.0 * pmin;
      if (a->cover_size != 0) {
        fVar5 = *(float *)(&DAT_002745f8 + (ulong)(0.0 < prediction) * 4);
        uVar4 = 0;
        do {
          uVar1 = uVar4 + 1;
          puVar2 = &(ec->super_example_predict).ft_offset;
          *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(l + 0xe0) * (int)uVar1);
          (**(code **)(l + 0x30))(*(undefined8 *)(l + 0x18),*(undefined8 *)(l + 0x20),ec);
          puVar2 = &(ec->super_example_predict).ft_offset;
          *puVar2 = *puVar2 - (ulong)(uint)(*(int *)(l + 0xe0) * (int)uVar1);
          fVar6 = fVar6 + (a->lambda_n[uVar4] / a->lambda_d[uVar4]) *
                          (float)(-(uint)(*(float *)(&DAT_002745f8 +
                                                    (ulong)(0.0 < (ec->pred).scalar) * 4) != fVar5)
                                 & 0x3f800000);
          uVar4 = uVar1;
        } while (uVar1 < a->cover_size);
      }
      fVar7 = SQRT(fVar6);
      fVar5 = fVar7;
      if (fVar6 < 0.0) {
        fVar5 = sqrtf(fVar6);
        fVar7 = sqrtf(fVar6);
      }
      fVar5 = fVar5 / (fVar7 + 1.0);
      fVar6 = 1.0;
      if ((~(uint)fVar5 & 0x7fc00000) != 0) {
        fVar6 = fVar5;
      }
      fVar5 = merand48(&a->all->random_state);
      fVar6 = (float)(-(uint)(fVar6 < fVar5) & 0xbf800000 |
                     ~-(uint)(fVar6 < fVar5) & (uint)(1.0 / fVar6));
    }
    else {
      fVar6 = 1.0;
    }
  }
  else {
    fVar6 = *(float *)(&DAT_002798c8 + (ulong)bVar3 * 4);
  }
  return fVar6;
}

Assistant:

float query_decision(active_cover& a, single_learner& l, example& ec, float prediction, float pmin, bool in_dis)
{
  if (a.all->sd->t + ec.weight <= 3)
  {
    return 1.f;
  }

  if (!in_dis)
  {
    return -1.f;
  }

  if (a.oracular)
  {
    return 1.f;
  }

  float p, q2 = 4.f * pmin * pmin;

  for (size_t i = 0; i < a.cover_size; i++)
  {
    l.predict(ec, i + 1);
    q2 += ((float)(sign(ec.pred.scalar) != sign(prediction))) * (a.lambda_n[i] / a.lambda_d[i]);
  }

  p = sqrt(q2) / (1 + sqrt(q2));

  if (nanpattern(p))
  {
    p = 1.f;
  }

  if (merand48(a.all->random_state) <= p)
  {
    return 1.f / p;
  }
  else
  {
    return -1.f;
  }
}